

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

void Cba_NtkCollectGroupStats(Cba_Ntk_t *p,Vec_Int_t *vObjs,int *pnFins,int *pnFons)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int i;
  int iVar4;
  
  iVar3 = 0;
  iVar4 = 0;
  for (i = 0; i < vObjs->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(vObjs,i);
    iVar2 = Cba_ObjFinNum(p,iVar1);
    iVar3 = iVar3 + iVar2;
    iVar1 = Cba_ObjFonNum(p,iVar1);
    iVar4 = iVar4 + iVar1;
  }
  *pnFins = iVar3;
  *pnFons = iVar4;
  return;
}

Assistant:

void Cba_NtkCollectGroupStats( Cba_Ntk_t * p, Vec_Int_t * vObjs, int * pnFins, int * pnFons )
{
    int i, iObj, nFins = 0, nFons = 0;
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        nFins += Cba_ObjFinNum(p, iObj);
        nFons += Cba_ObjFonNum(p, iObj);
    }
    *pnFins = nFins;
    *pnFons = nFons;
}